

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O1

XXH_errorcode XXH32_update(XXH32_state_t *state_in,void *input,size_t len)

{
  uint uVar1;
  BYTE *limit;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  
  uVar1 = state_in->total_len_32 + (int)len;
  state_in->total_len_32 = uVar1;
  state_in->large_len = state_in->large_len | (uint)(0xf < uVar1 || 0xf < len);
  uVar2 = (ulong)state_in->memsize;
  if (uVar2 + len < 0x10) {
    memcpy((void *)((long)state_in->mem32 + uVar2),input,len);
    uVar1 = state_in->memsize + (int)len;
  }
  else {
    piVar6 = (int *)(len + (long)input);
    if (uVar2 != 0) {
      memcpy((void *)((long)state_in->mem32 + uVar2),input,(ulong)(0x10 - state_in->memsize));
      uVar1 = state_in->mem32[0] * -0x7a143589 + state_in->v1;
      state_in->v1 = (uVar1 * 0x2000 | uVar1 >> 0x13) * -0x61c8864f;
      uVar1 = state_in->mem32[1] * -0x7a143589 + state_in->v2;
      state_in->v2 = (uVar1 * 0x2000 | uVar1 >> 0x13) * -0x61c8864f;
      uVar1 = state_in->mem32[2] * -0x7a143589 + state_in->v3;
      state_in->v3 = (uVar1 * 0x2000 | uVar1 >> 0x13) * -0x61c8864f;
      uVar1 = state_in->mem32[3] * -0x7a143589 + state_in->v4;
      state_in->v4 = (uVar1 * 0x2000 | uVar1 >> 0x13) * -0x61c8864f;
      input = (void *)((long)input + (ulong)(0x10 - state_in->memsize));
      state_in->memsize = 0;
    }
    if (input <= piVar6 + -4) {
      uVar1 = state_in->v1;
      uVar4 = state_in->v2;
      uVar3 = state_in->v3;
      uVar5 = state_in->v4;
      do {
        uVar1 = *input * -0x7a143589 + uVar1;
        uVar4 = *(int *)((long)input + 4) * -0x7a143589 + uVar4;
        uVar1 = (uVar1 * 0x2000 | uVar1 >> 0x13) * -0x61c8864f;
        uVar3 = *(int *)((long)input + 8) * -0x7a143589 + uVar3;
        uVar4 = (uVar4 * 0x2000 | uVar4 >> 0x13) * -0x61c8864f;
        uVar5 = *(int *)((long)input + 0xc) * -0x7a143589 + uVar5;
        uVar3 = (uVar3 * 0x2000 | uVar3 >> 0x13) * -0x61c8864f;
        uVar5 = (uVar5 * 0x2000 | uVar5 >> 0x13) * -0x61c8864f;
        input = (void *)((long)input + 0x10);
      } while (input <= piVar6 + -4);
      state_in->v1 = uVar1;
      state_in->v2 = uVar4;
      state_in->v3 = uVar3;
      state_in->v4 = uVar5;
    }
    if (piVar6 <= input) {
      return XXH_OK;
    }
    memcpy(state_in->mem32,input,(long)piVar6 - (long)input);
    uVar1 = (uint)((long)piVar6 - (long)input);
  }
  state_in->memsize = uVar1;
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH32_update (XXH32_state_t* state_in, const void* input, size_t len)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH32_update_endian(state_in, input, len, XXH_littleEndian);
    else
        return XXH32_update_endian(state_in, input, len, XXH_bigEndian);
}